

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local-utils.h
# Opt level: O0

int __thiscall wasm::UnneededSetRemover::remove(UnneededSetRemover *this,char *__filename)

{
  bool bVar1;
  Drop *this_00;
  Drop *drop;
  EffectAnalyzer local_180;
  Expression *local_20;
  Expression *value;
  LocalSet *set_local;
  UnneededSetRemover *this_local;
  
  local_20 = *(Expression **)(__filename + 0x18);
  value = (Expression *)__filename;
  set_local = (LocalSet *)this;
  bVar1 = LocalSet::isTee((LocalSet *)__filename);
  if (bVar1) {
    Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::replaceCurrent
              ((Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_> *)
               this,local_20);
    bVar1 = wasm::Type::operator!=(&local_20->type,&value->type);
    if (bVar1) {
      this->refinalize = true;
    }
  }
  else {
    EffectAnalyzer::EffectAnalyzer
              (&local_180,this->passOptions,this->module,(Expression *)value[1].type.id);
    bVar1 = EffectAnalyzer::hasSideEffects(&local_180);
    EffectAnalyzer::~EffectAnalyzer(&local_180);
    if (bVar1) {
      this_00 = ExpressionManipulator::convert<wasm::LocalSet,wasm::Drop>((LocalSet *)value);
      this_00->value = local_20;
      Drop::finalize(this_00);
    }
    else {
      ExpressionManipulator::nop<wasm::LocalSet>((LocalSet *)value);
    }
  }
  this->removed = true;
  return (int)this;
}

Assistant:

void remove(LocalSet* set) {
    auto* value = set->value;
    if (set->isTee()) {
      replaceCurrent(value);
      if (value->type != set->type) {
        // The value is more refined, so we'll need to refinalize.
        refinalize = true;
      }
    } else if (EffectAnalyzer(passOptions, module, set->value)
                 .hasSideEffects()) {
      Drop* drop = ExpressionManipulator::convert<LocalSet, Drop>(set);
      drop->value = value;
      drop->finalize();
    } else {
      ExpressionManipulator::nop(set);
    }
    removed = true;
  }